

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription
          (storage_t *this,mbox_t *mbox,type_index *msg_type,state_t *target_state)

{
  subscr_map_t *this_00;
  abstract_message_box_t *paVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  iterator it;
  agent_t *paVar4;
  mbox_id_t local_38;
  
  this_00 = &this->m_events;
  iVar3 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_38 = CONCAT44(extraout_var,iVar3);
  it = (anonymous_namespace)::
       find<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>>
                 (this_00,&local_38,msg_type,target_state);
  if ((_Rb_tree_header *)it._M_node != &(this->m_events)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = (anonymous_namespace)::
            is_known_mbox_msg_pair<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>,std::_Rb_tree_iterator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                      (this_00,(_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                                )it._M_node);
    std::
    _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
    ::erase_abi_cxx11_((_Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                        *)this_00,(iterator)it._M_node);
    if (!bVar2) {
      paVar1 = mbox->m_obj;
      paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      UNRECOVERED_JUMPTABLE = paVar1->_vptr_abstract_message_box_t[4];
      (*UNRECOVERED_JUMPTABLE)(paVar1,msg_type,paVar4,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription(
	const mbox_t & mbox,
	const std::type_index & msg_type,
	const state_t & target_state )
	{
		auto existed_position = find(
				m_events, mbox->id(), msg_type, target_state );
		if( existed_position != m_events.end() )
			{
				// Note v.5.5.9 unsubscribe_event_handlers is called for
				// mbox even if it is MPSC mbox. It is necessary for the case
				// of message delivery tracing.

				// We must destroy mbox subscription in case if the agent has no
				// more subscriptions for that mbox+msg_type pair.
				// Detect this while existed_position is not invalidated.
				bool must_unsubscribe_mbox =
						!is_known_mbox_msg_pair( m_events, existed_position );

				m_events.erase( existed_position );

				if( must_unsubscribe_mbox )
					{
						mbox->unsubscribe_event_handlers( msg_type, owner() );
					}
			}
	}